

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::emit_wave_active_bit_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  uint uVar4;
  Id type_id;
  Builder *this;
  Operation *this_00;
  Value *pVVar5;
  Builder *this_01;
  Builder *this_02;
  Type *pTVar6;
  Operation *this_03;
  Op op;
  uint32_t op_kind;
  Operation *local_38;
  
  this = Converter::Impl::builder(impl);
  bVar1 = get_constant_operand(&instruction->super_Instruction,2,&op_kind);
  if (bVar1) {
    op = (op_kind & 0xff) + OpGroupNonUniformBitwiseAnd;
    if (2 < (byte)op_kind) {
      op = OpNop;
    }
    this_00 = Converter::Impl::allocate(impl,op,(Value *)instruction);
    IVar2 = spv::Builder::makeUintConstant(this,3,false);
    Operation::add_id(this_00,IVar2);
    Operation::add_literal(this_00,0);
    pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
    if (((impl->execution_model == ExecutionModelFragment) &&
        ((impl->options).strict_helper_lane_waveops == true)) &&
       (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
      this_01 = Converter::Impl::builder(impl);
      this_02 = Converter::Impl::builder(impl);
      IVar3 = spv::Builder::makeBoolType(this_02);
      local_38 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar3);
      Converter::Impl::add(impl,local_38,false);
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      pTVar6 = LLVMBC::Value::getType(pVVar5);
      uVar4 = LLVMBC::Type::getIntegerBitWidth(pTVar6);
      if (uVar4 == 0x40) {
        IVar3 = spv::Builder::makeUint64Constant(this_01,-(ulong)((byte)op_kind == 0),false);
      }
      else if (uVar4 == 0x20) {
        IVar3 = spv::Builder::makeUintConstant(this_01,-(uint)((byte)op_kind == 0),false);
      }
      else {
        IVar3 = 0;
        if (uVar4 == 0x10) {
          IVar3 = spv::Builder::makeUint16Constant(this_01,-(ushort)((byte)op_kind == 0),false);
        }
      }
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      pTVar6 = LLVMBC::Value::getType(pVVar5);
      type_id = Converter::Impl::get_type_id(impl,pTVar6,0);
      this_03 = Converter::Impl::allocate(impl,OpSelect,type_id);
      Operation::add_id(this_03,local_38->id);
      Operation::add_id(this_03,IVar3);
      Operation::add_id(this_03,IVar2);
      Converter::Impl::add(impl,this_03,false);
      IVar2 = this_03->id;
    }
    Operation::add_id(this_00,IVar2);
    Converter::Impl::add(impl,this_00,false);
    spv::Builder::addCapability(this,CapabilityGroupNonUniformArithmetic);
  }
  return bVar1;
}

Assistant:

bool emit_wave_active_bit_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	spv::Op opcode = spv::OpNop;

	uint32_t op_kind;
	if (!get_constant_operand(instruction, 2, &op_kind))
		return false;

	switch (static_cast<DXIL::WaveBitOpKind>(op_kind))
	{
	case DXIL::WaveBitOpKind::And:
		opcode = spv::OpGroupNonUniformBitwiseAnd;
		break;

	case DXIL::WaveBitOpKind::Or:
		opcode = spv::OpGroupNonUniformBitwiseOr;
		break;

	case DXIL::WaveBitOpKind::Xor:
		opcode = spv::OpGroupNonUniformBitwiseXor;
		break;
	}

	auto *op = impl.allocate(opcode, instruction);
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_literal(spv::GroupOperationReduce);

	spv::Id input_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		input_value = build_mask_reduction_input_bitwise(impl, instruction, input_value, DXIL::WaveBitOpKind(op_kind));

	op->add_id(input_value);

	impl.add(op);

	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	return true;
}